

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O3

skynet_context * skynet_handle_grab(uint32_t handle)

{
  int *piVar1;
  handle_storage *phVar2;
  uint32_t uVar3;
  skynet_context *ctx;
  
  phVar2 = H;
  while( true ) {
    do {
    } while ((phVar2->lock).write != 0);
    LOCK();
    piVar1 = &(phVar2->lock).read;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if ((phVar2->lock).write == 0) break;
    LOCK();
    piVar1 = &(phVar2->lock).read;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
  }
  ctx = phVar2->slot[phVar2->slot_size - 1U & handle];
  if ((ctx == (skynet_context *)0x0) || (uVar3 = skynet_context_handle(ctx), uVar3 != handle)) {
    ctx = (skynet_context *)0x0;
  }
  else {
    skynet_context_grab(ctx);
  }
  LOCK();
  piVar1 = &(phVar2->lock).read;
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  return ctx;
}

Assistant:

struct skynet_context * 
skynet_handle_grab(uint32_t handle) {
	struct handle_storage *s = H;
	struct skynet_context * result = NULL;

	rwlock_rlock(&s->lock);

	uint32_t hash = handle & (s->slot_size-1);
	struct skynet_context * ctx = s->slot[hash];
	if (ctx && skynet_context_handle(ctx) == handle) {
		result = ctx;
		skynet_context_grab(result);
	}

	rwlock_runlock(&s->lock);

	return result;
}